

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

vec3 vec3_orthogonal(vec3 u)

{
  _Bool _Var1;
  vec3 vVar2;
  vec3 v2;
  undefined8 local_c8;
  undefined4 local_c0;
  vec3 v;
  undefined4 local_60;
  undefined8 local_28;
  vec3 u_local;
  
  vVar2 = vec3_normalize(u);
  local_60 = vVar2.z;
  stack0xffffffffffffff98 = vVar2._0_8_;
  u_local.x = local_60;
  local_28 = stack0xffffffffffffff98;
  v2 = vec3_create(1.0,0.0,0.0);
  _Var1 = vec3_equal(vVar2,v2);
  if (_Var1) {
    vVar2 = vec3_create(0.0,1.0,0.0);
    local_c8 = vVar2._0_8_;
    local_c0 = vVar2.z;
    local_28 = local_c8;
    u_local.x = local_c0;
  }
  vVar2.z = u_local.x;
  vVar2.x = (float)(undefined4)local_28;
  vVar2.y = (float)local_28._4_4_;
  vVar2 = vec3_cross(vVar2,v2);
  return vVar2;
}

Assistant:

vec3 vec3_orthogonal(vec3 u) {
    u = vec3_normalize(u);
    vec3 v = V3(1.0f, 0.0f, 0.0f);
    if (vec3_equal(u, v)) {
        u = V3(0.0f, 1.0f, 0.0f);
    }
    return vec3_cross(u, v);
}